

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O3

void __thiscall covenant::DFA<covenant::Sym>::nondet_union(DFA<covenant::Sym> *this,dfa_t *other)

{
  State SVar1;
  State r;
  pointer pvVar2;
  DFA<covenant::Sym> *pDVar3;
  bool bVar4;
  State s;
  pointer pvVar5;
  string *psVar6;
  int iVar7;
  pointer pvVar8;
  socklen_t *__addr_len;
  undefined1 *puVar9;
  long lVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  emplace_return eVar16;
  MapStates mapping;
  ulong local_98;
  DFA<covenant::Sym> *local_90;
  uint local_84;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  local_80;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  if (((other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p !=
       (other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p) ||
     ((other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0)) {
    pvVar5 = (other->trans).
             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (other->trans).
             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pvVar5 != pvVar8) ||
       ((other->eps).
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (other->eps).
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_80.super_functions<boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>.current_ =
           '\0';
      uVar11 = 0x26;
      puVar9 = boost::unordered::detail::prime_list_template<unsigned_long>::value;
      do {
        uVar13 = uVar11 >> 1;
        uVar14 = ~uVar13 + uVar11;
        uVar11 = uVar13;
        if (*(ulong *)((long)puVar9 + uVar13 * 8) < 0xb) {
          puVar9 = (undefined1 *)((ulong *)((long)puVar9 + uVar13 * 8) + 1);
          uVar11 = uVar14;
        }
      } while (0 < (long)uVar11);
      puVar12 = (ulong *)(boost::unordered::detail::prime_list_template<unsigned_long>::value +
                         0x128);
      if (puVar9 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
        puVar12 = (ulong *)puVar9;
      }
      local_80.bucket_count_ = *puVar12;
      local_80.size_ = 0;
      local_80.mlf_ = 1.0;
      local_80.max_load_ = 0;
      local_80.buckets_ = (bucket_pointer)0x0;
      local_90 = this;
      if (0 < (int)((ulong)((long)pvVar8 - (long)pvVar5) >> 3) * -0x55555555) {
        uVar13 = ((long)(this->trans).
                        super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->trans).
                        super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar10 = 0;
        uVar11 = uVar13 & 0xffffffff;
        do {
          local_98 = (uVar11 << 0x20) + lVar10;
          boost::unordered::detail::
          table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
          ::emplace_unique<std::pair<int,unsigned_int>>
                    ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                      *)&local_80,&local_98);
          state(local_90,(int)uVar13 + (int)lVar10);
          uVar11 = (ulong)((int)uVar11 + 1);
          lVar10 = lVar10 + 1;
          pvVar5 = (other->trans).
                   super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar8 = (other->trans).
                   super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (lVar10 < (int)((ulong)((long)pvVar8 - (long)pvVar5) >> 3) * -0x55555555);
      }
      local_98 = local_98 & 0xffffffff00000000;
      if (pvVar8 != pvVar5) {
        uVar11 = 0;
        do {
          if (pvVar5[uVar11].
              super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              pvVar5[uVar11].
              super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar13 = 0;
            uVar14 = 1;
            do {
              eVar16 = boost::unordered::detail::
                       table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                       ::try_emplace_unique<unsigned_int_const&>
                                 ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                   *)&local_80,(uint *)&local_98);
              SVar1.id = *(uint *)((long)&((eVar16.first.node_.node_)->value_base_).data_.data_ + 4)
              ;
              lVar10 = *(long *)&(other->trans).
                                 super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[local_98 & 0xffffffff].
                                 super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                 ._M_impl.super__Vector_impl_data;
              eVar16 = boost::unordered::detail::
                       table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                       ::try_emplace_unique<unsigned_int_const&>
                                 ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                   *)&local_80,(uint *)(lVar10 + uVar13 * 8 + 4));
              transition(local_90,SVar1,(Sym *)(lVar10 + uVar13 * 8),
                         (State)*(uint *)((long)&((eVar16.first.node_.node_)->value_base_).data_.
                                                 data_ + 4));
              uVar11 = local_98 & 0xffffffff;
              pvVar5 = (other->trans).
                       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              bVar4 = uVar14 < (ulong)((long)pvVar5[uVar11].
                                             super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pvVar5[uVar11].
                                             super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar13 = uVar14;
              uVar14 = (ulong)((int)uVar14 + 1);
            } while (bVar4);
          }
          pDVar3 = local_90;
          pvVar2 = (other->eps).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar7 = (int)uVar11;
          if (*(pointer *)
               ((long)&pvVar2[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data + 8) !=
              pvVar2[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar11 = 0;
            uVar13 = 1;
            do {
              eVar16 = boost::unordered::detail::
                       table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                       ::try_emplace_unique<unsigned_int_const&>
                                 ((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,unsigned_int>>,unsigned_int,unsigned_int,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                   *)&local_80,(uint *)&local_98);
              SVar1.id = *(uint *)((long)&((eVar16.first.node_.node_)->value_base_).data_.data_ + 4)
              ;
              local_84 = *(uint *)(*(long *)&(other->eps).
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start
                                             [local_98 & 0xffffffff].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data + uVar11 * 4);
              eVar16 = boost::unordered::detail::
                       table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                       ::try_emplace_unique<unsigned_int>(&local_80,&local_84);
              eps_transition(pDVar3,SVar1,
                             (State)*(uint *)((long)&((eVar16.first.node_.node_)->value_base_).data_
                                                     .data_ + 4));
              pvVar2 = (other->eps).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              bVar4 = uVar13 < (ulong)((long)*(pointer *)
                                              ((long)&pvVar2[local_98 & 0xffffffff].
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data + 8) -
                                       *(long *)&pvVar2[local_98 & 0xffffffff].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data >> 2);
              uVar11 = uVar13;
              uVar13 = (ulong)((int)uVar13 + 1);
            } while (bVar4);
            pvVar5 = (other->trans).
                     super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar7 = (int)local_98;
          }
          uVar11 = (ulong)(iVar7 + 1U);
          local_98 = CONCAT44(local_98._4_4_,iVar7 + 1U);
          pvVar8 = (other->trans).
                   super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar13 = ((long)pvVar8 - (long)pvVar5 >> 3) * -0x5555555555555555;
        } while (uVar11 <= uVar13 && uVar13 - uVar11 != 0);
        if (0 < (int)uVar13) {
          uVar11 = 0;
          do {
            __addr_len = (socklen_t *)
                         (other->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [uVar11 >> 6];
            if (((ulong)__addr_len >> (uVar11 & 0x3f) & 1) != 0) {
              local_98 = CONCAT44(local_98._4_4_,(int)uVar11);
              eVar16 = boost::unordered::detail::
                       table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                       ::try_emplace_unique<unsigned_int>(&local_80,(uint *)&local_98);
              accept(local_90,*(int *)((long)&((eVar16.first.node_.node_)->value_base_).data_.data_
                                      + 4),eVar16._8_8_,__addr_len);
              pvVar5 = (other->trans).
                       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar8 = (other->trans).
                       super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            }
            uVar15 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar15;
            iVar7 = (int)((ulong)((long)pvVar8 - (long)pvVar5) >> 3);
          } while (SBORROW4(uVar15,iVar7 * -0x55555555) != (int)(uVar15 + iVar7 * 0x55555555) < 0);
        }
      }
      pDVar3 = local_90;
      s = state(local_90,(int)((ulong)((long)(local_90->trans).
                                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(local_90->trans).
                                            super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x55555555);
      SVar1.id = pDVar3->start;
      local_98 = CONCAT44(local_98._4_4_,other->start);
      eVar16 = boost::unordered::detail::
               table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
               ::try_emplace_unique<unsigned_int>(&local_80,(uint *)&local_98);
      r.id = *(uint *)((long)&((eVar16.first.node_.node_)->value_base_).data_.data_ + 4);
      eps_transition(pDVar3,s,SVar1);
      eps_transition(pDVar3,s,r);
      pDVar3->start = s.id;
      eps_elim(pDVar3);
      bVar4 = eliminateDeadStates(pDVar3);
      if (!bVar4) {
        psVar6 = (string *)__cxa_allocate_exception(0x20);
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"nondet union of DFA\'s returned an empty automata","");
        *(string **)psVar6 = psVar6 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar6,local_50,local_50 + local_48);
        __cxa_throw(psVar6,&error::typeinfo,error::~error);
      }
      boost::unordered::detail::
      table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
      ::~table(&local_80);
    }
  }
  return;
}

Assistant:

void nondet_union(const dfa_t &other)
    { 
      
      if (other.accepts.empty()) 
        return;
      if (other.trans.empty() && other.eps.empty()) 
        return;
      
      MapStates mapping; // mapping to relabel states old -> new
      
      unsigned int nstates = (unsigned int) this->nStates();
      for(int i=0; i< other.nStates(); i++)
      {
        mapping.insert(make_pair(i, nstates));
        this->state(nstates++);
      }
      
      for( unsigned int ss = 0; ss < other.trans.size(); ss++ )
      {
        for( unsigned int ti = 0; ti < other.trans[ss].size(); ti++ )
        {
          this->transition(mkState(mapping[ss]), 
                           other.trans[ss][ti].val,
                           mkState(mapping[other.trans[ss][ti].dest]));
        }
        for(unsigned int ei = 0; ei < other.eps[ss].size(); ei++)
        {
          this->eps_transition(mkState(mapping[ss]), 
                               mkState(mapping[other.eps[ss][ei]])); 
        }
      }
      
      // set new accepting states
      for (int i=0; i < other.nStates() ; i++)
      {
        if (other.accepts[i])
          this->accept(mkState(mapping[i]));
      }
      
      // finally, set new initial state
      State new_start       = this->state(this->nStates());
      State old_start_ndfa  = this->startState();
      State old_start_other = mkState(mapping[other.startState().id]);
      this->eps_transition(new_start, old_start_ndfa);
      this->eps_transition(new_start, old_start_other);
      this->setStart(new_start);
      // Make sure no epsilon transitions after union
      this->eps_elim();    
      bool is_not_empty = this->eliminateDeadStates();
      if (!is_not_empty)
        throw error("nondet union of DFA's returned an empty automata");
    }